

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inter_Symbol_Generator.cc
# Opt level: O2

int __thiscall
Inter_Symbol_Generator::LDPC_Matrix_Generator(Inter_Symbol_Generator *this,Array_Data_Symbol *p)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  uint8_t **ppuVar4;
  int i;
  ulong uVar5;
  
  ppuVar4 = new_matrix(this,p->S,p->K);
  this->G_LDPC = ppuVar4;
  for (uVar5 = 0; uVar5 < p->K; uVar5 = uVar5 + 1) {
    uVar1 = p->S;
    uVar2 = (uVar5 & 0xffffffff) % (ulong)uVar1;
    this->G_LDPC[uVar2][uVar5] = '\x01';
    iVar3 = (int)(((uVar5 & 0xffffffff) / (ulong)uVar1) % (ulong)(uVar1 - 1));
    uVar2 = (ulong)((int)uVar2 + iVar3 + 1) % (ulong)p->S;
    this->G_LDPC[uVar2][uVar5] = '\x01';
    this->G_LDPC[(ulong)((int)uVar2 + iVar3 + 1) % (ulong)p->S][uVar5] = '\x01';
  }
  return 0;
}

Assistant:

int Inter_Symbol_Generator::LDPC_Matrix_Generator(class Array_Data_Symbol *p)
{

	uint32_t a = 0;
	uint32_t b = 0;

	// G_LDPC = new uint8_t* [p->S]; 

	// for (int i = 0; i < p->S; i++)
	// {
	// 	G_LDPC[i] = new uint8_t[p->K];
	// }


	// for (int i = 0; i < p->S; i++)
	// {
	// 	for (int j = 0; j < p->K; j++)
	// 	{
	// 		G_LDPC[i][j] = 0;
	// 	}
	// }

	G_LDPC = new_matrix(p->S, p->K);


	for (int i = 0; i < p->K; i++)
	{
		a = 1 + ((uint32_t)floor( (double)(i / p->S)) % (p->S - 1));
		b = i % p->S;
		G_LDPC[b][i] = 1;
		b = (b + a) % p->S;
		G_LDPC[b][i] = 1;
		b = (b + a) % p->S;
		G_LDPC[b][i] = 1;		

	}


	return 0;
}